

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createS2N(IRBuilder *this,Value *rhs,string *name)

{
  int iVar1;
  _Alloc_hider __nptr;
  long lVar2;
  int *piVar3;
  pointer pcVar4;
  ConstantValue<long,_(flow::LiteralType)2> *pCVar5;
  undefined8 uVar6;
  string local_68;
  Value *local_48;
  pointer local_40;
  LiteralType local_34;
  
  local_48 = rhs;
  if (rhs->type_ != String) {
    __assert_fail("rhs->type() == LiteralType::String",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x26b,"Value *flow::IRBuilder::createS2N(Value *, const std::string &)");
  }
  lVar2 = __dynamic_cast(rhs,&Value::typeinfo,
                         &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
  if (lVar2 != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,*(long *)(lVar2 + 0x48),
               *(long *)(lVar2 + 0x50) + *(long *)(lVar2 + 0x48));
    __nptr._M_p = local_68._M_dataplus._M_p;
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    *piVar3 = 0;
    pcVar4 = (pointer)strtol(__nptr._M_p,&local_40,10);
    if (local_40 == __nptr._M_p) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((pointer)(long)(int)pcVar4 == pcVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      local_40 = pcVar4;
      pCVar5 = IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                         (this->program_,&this->program_->numbers_,(long *)&local_40);
      goto LAB_00142c54;
    }
    uVar6 = std::__throw_out_of_range("stoi");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    __cxa_begin_catch(uVar6);
    __cxa_end_catch();
  }
  local_34 = Number;
  makeName(&local_68,this,name);
  pCVar5 = (ConstantValue<long,_(flow::LiteralType)2> *)
           insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                     (this,&local_34,&local_48,&local_68);
LAB_00142c54:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return (Value *)pCVar5;
}

Assistant:

Value* IRBuilder::createS2N(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::String);

  if (auto value = dynamic_cast<ConstantString*>(rhs)) {
    try {
      return get(stoi(value->get()));
    } catch (...) {
      // fall through to default behaviour
    }
  }

  return insert<CastInstr>(LiteralType::Number, rhs, makeName(name));
}